

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
slang::ast::FmtHelpers::formatDisplay_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FmtHelpers *this,Scope *scope,EvalContext *context,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args)

{
  Symbol **ppSVar1;
  undefined8 *puVar2;
  ExpressionKind EVar3;
  SymbolKind SVar4;
  Compilation *this_00;
  Type *this_01;
  function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)> onError;
  ulong uVar5;
  bool bVar6;
  Type *type;
  char *pcVar7;
  ulong uVar8;
  StringLiteral *lit;
  char cVar9;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> onText;
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  onArg;
  string_view str;
  bool ok;
  iterator argIt;
  string result;
  byte local_c3;
  char local_c2;
  undefined1 local_c1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c0;
  Scope *local_b8;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  FormatOptions local_90;
  FmtHelpers *local_78;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_70;
  Scope *local_50;
  byte *local_48;
  code *local_40;
  undefined1 *puStack_38;
  
  local_b0._M_p = (pointer)&local_a0;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_b8 = (context->astCtx).scope.ptr;
  local_c0 = __return_storage_ptr__;
  local_78 = this;
  if (*(long *)&(context->astCtx).lookupIndex != 0) {
    do {
      ppSVar1 = &local_b8->thisSym;
      this_00 = local_b8->compilation;
      EVar3 = *(ExpressionKind *)&(this_00->super_BumpAllocator).head;
      local_b8 = (Scope *)ppSVar1;
      if (EVar3 == StringLiteral) {
        uVar8 = *(ulong *)&(this_00->options).typoCorrectionLimit;
        pcVar7 = *(char **)&(this_00->options).languageVersion;
        if (1 < uVar8) {
          uVar5 = uVar8 - 2;
          uVar8 = uVar8 - 1;
          if (uVar5 <= uVar8) {
            uVar8 = uVar5;
          }
          pcVar7 = pcVar7 + 1;
        }
        local_c3 = 1;
        local_70._0_8_ = local_78;
        local_70._16_8_ = &local_b8;
        local_48 = &local_c3;
        local_40 = function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>
                   ::
                   callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__2>
        ;
        puStack_38 = &local_c1;
        onError.callable = (intptr_t)puStack_38;
        onError.callback =
             function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>::
             callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__2>
        ;
        onText.callable = (intptr_t)&local_90;
        onText.callback =
             function_ref<void(std::basic_string_view<char,std::char_traits<char>>)>::
             callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__0>
        ;
        onArg.callable = (intptr_t)&local_70;
        onArg.callback =
             function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
             ::
             callback_fn<slang::ast::FmtHelpers::formatDisplay[abi:cxx11](slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&)::__1>
        ;
        str._M_str = pcVar7;
        str._M_len = uVar8;
        local_90.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)&local_b0;
        local_70._8_8_ = &local_b0;
        local_70._24_8_ = context;
        local_50 = scope;
        bVar6 = SFormat::parse(str,onText,onArg,onError);
        local_c3 = bVar6 & local_c3;
        if (local_c3 != 0) goto LAB_003b220d;
        (local_c0->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false;
LAB_003b2211:
        bVar6 = true;
      }
      else if (EVar3 == EmptyArgument) {
        bVar6 = false;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                   ' ');
      }
      else {
        Expression::eval((ConstantValue *)&local_70,(Expression *)this_00,(EvalContext *)scope);
        local_c2 = (char)local_50;
        if ((char)local_50 == '\0') {
          (local_c0->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
        }
        else {
          this_01 = ((not_null<const_slang::ast::Type_*> *)&(this_00->super_BumpAllocator).endPtr)->
                    ptr;
          bVar6 = Type::isIntegral(this_01);
          cVar9 = 'd';
          if (!bVar6) {
            if (this_01->canonical == (Type *)0x0) {
              Type::resolveCanonical(this_01);
            }
            SVar4 = (this_01->canonical->super_Symbol).kind;
            cVar9 = 'f';
            if (SVar4 != FloatingType) {
              cVar9 = (SVar4 == StringType) * '\x03' + 'p';
            }
          }
          local_90.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged = false;
          local_90.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged = false;
          local_90.leftJustify = false;
          local_90.zeroPad = false;
          bVar6 = Expression::isImplicitString((Expression *)this_00);
          SFormat::formatArg((string *)&local_b0,(ConstantValue *)&local_70,this_01,cVar9,&local_90,
                             bVar6);
        }
        cVar9 = local_c2;
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_70);
        if (cVar9 == '\0') goto LAB_003b2211;
LAB_003b220d:
        bVar6 = false;
      }
      if (bVar6) goto LAB_003b2283;
    } while (local_b8 !=
             (Scope *)(&((context->astCtx).scope.ptr)->compilation +
                      *(long *)&(context->astCtx).lookupIndex));
  }
  puVar2 = (undefined8 *)
           ((long)&(local_c0->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x10);
  *(undefined8 **)
   &(local_c0->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload = puVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p == &local_a0) {
    *puVar2 = CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]);
    *(undefined8 *)
     ((long)&(local_c0->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload + 0x18) = local_a0._8_8_;
  }
  else {
    (local_c0->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = local_b0._M_p;
    *(ulong *)((long)&(local_c0->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10) =
         CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]);
  }
  (local_c0->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = local_a8;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  (local_c0->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = true;
  local_b0._M_p = (pointer)&local_a0;
LAB_003b2283:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,
                    CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
  }
  return local_c0;
}

Assistant:

std::optional<std::string> FmtHelpers::formatDisplay(
    const Scope& scope, EvalContext& context, const std::span<const Expression* const>& args) {
    std::string result;
    auto argIt = args.begin();
    while (argIt != args.end()) {
        // Empty arguments always print a space.
        auto arg = *argIt++;
        if (arg->kind == ExpressionKind::EmptyArgument) {
            result.push_back(' ');
            continue;
        }

        // Handle string literals as format strings.
        if (arg->kind == ExpressionKind::StringLiteral) {
            // Strip quotes from the raw string.
            auto& lit = arg->as<StringLiteral>();
            std::string_view fmt = lit.getRawValue();
            if (fmt.length() >= 2)
                fmt = fmt.substr(1, fmt.length() - 2);

            bool ok = true;
            bool parseOk = SFormat::parse(
                fmt, [&](std::string_view text) { result += text; },
                [&](char specifier, size_t, size_t, const SFormat::FormatOptions& options) {
                    if (formatSpecialArg(specifier, scope, result))
                        return;

                    if (argIt != args.end()) {
                        auto currentArg = *argIt++;
                        auto&& value = currentArg->eval(context);
                        if (!value) {
                            ok = false;
                            return;
                        }

                        SFormat::formatArg(result, value, *currentArg->type, specifier, options,
                                           currentArg->isImplicitString());
                    }
                },
                [](DiagCode, size_t, size_t, std::optional<char>) {});

            ok &= parseOk;
            if (!ok)
                return std::nullopt;
        }
        else {
            // Otherwise, print the value with default options.
            auto&& value = arg->eval(context);
            if (!value)
                return std::nullopt;

            SFormat::formatArg(result, value, *arg->type,
                               getDefaultSpecifier(*arg, LiteralBase::Decimal), {},
                               arg->isImplicitString());
        }
    }

    return result;
}